

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedList.h
# Opt level: O1

LinkedList<int> * __thiscall LinkedList<int>::operator=(LinkedList<int> *this,LinkedList<int> *copy)

{
  Node<int> *pNVar1;
  Node<int> **ppNVar2;
  Node<int> *pNVar3;
  Node<int> *pNVar4;
  Node<int> *pNVar5;
  Node<int> *pNVar6;
  
  this->size = copy->size;
  pNVar6 = this->head;
  while (pNVar6 != (Node<int> *)0x0) {
    pNVar4 = pNVar6->next;
    operator_delete(pNVar6,0x10);
    pNVar6 = pNVar4;
  }
  pNVar6 = this->head;
  pNVar4 = this->tail;
  pNVar5 = copy->head;
  do {
    pNVar1 = pNVar5->next;
    pNVar3 = (Node<int> *)operator_new(0x10);
    *(undefined8 *)pNVar3 = 0;
    pNVar3->next = (Node<int> *)0x0;
    pNVar3->data = pNVar5->data;
    pNVar3->next = (Node<int> *)0x0;
    ppNVar2 = &pNVar4->next;
    if (pNVar6 == (Node<int> *)0x0) {
      pNVar6 = pNVar3;
      ppNVar2 = &this->head;
    }
    *ppNVar2 = pNVar3;
    this->tail = pNVar3;
    pNVar4 = pNVar3;
    pNVar5 = pNVar1;
  } while( true );
}

Assistant:

LinkedList<T>& LinkedList<T>::operator=(const LinkedList &copy)
{
    auto curr = head;
    size = copy.size;

    while(curr != nullptr)
    {
        auto currNext = curr->next;
        delete curr;
        curr = currNext;
    }

    curr = copy.head;
    while(curr != nullptr)
    {
        auto currNext = curr->next;
        auto *node = new Node<T>();
        node->data = curr->data;
        node->next = nullptr;

        if(head == nullptr)
        {
            head = node;
            tail = node;
        } else
        {
            tail->next = node;
            tail = node;
        }
        curr = currNext;
    }
}